

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

shared_ptr<const_helics::SmallBuffer> * __thiscall
helics::CommonCore::getValue(CommonCore *this,InterfaceHandle handle,uint32_t *inputIndex)

{
  pair<helics::route_id,_helics::ActionMessage> *ppVar1;
  char *__str;
  undefined8 uVar2;
  shared_ptr<const_helics::SmallBuffer> *psVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  lock_guard<helics::FederateState> lock;
  FederateState *fed;
  pair<helics::route_id,_helics::ActionMessage> *handleInfo;
  CommonCore *in_stack_ffffffffffffff68;
  lock_guard<helics::FederateState> *in_stack_ffffffffffffff70;
  FederateState *in_stack_ffffffffffffff78;
  InterfaceHandle handle_00;
  string_view in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  LocalFederateId federateID;
  
  federateID.fid = (BaseType)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  ppVar1 = getHandleInfo(in_stack_ffffffffffffff68,
                         (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (ppVar1 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,__str);
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_RDI,in_stack_ffffffffffffff88);
    __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  if ((char)(ppVar1->second).messageID != 'i') {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)in_stack_ffffffffffffff78);
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_RDI,in_stack_ffffffffffffff88);
    __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  getFederateAt((CommonCore *)CONCAT44((ppVar1->second).messageAction,in_stack_ffffffffffffffa8),
                federateID);
  handle_00.hid = (BaseType)((ulong)in_RDI >> 0x20);
  std::lock_guard<helics::FederateState>::lock_guard
            (in_stack_ffffffffffffff70,(mutex_type *)in_stack_ffffffffffffff68);
  psVar3 = FederateState::getValue
                     (in_stack_ffffffffffffff78,handle_00,(uint32_t *)in_stack_ffffffffffffff70);
  std::lock_guard<helics::FederateState>::~lock_guard((lock_guard<helics::FederateState> *)0x46fe7e)
  ;
  return psVar3;
}

Assistant:

const std::shared_ptr<const SmallBuffer>& CommonCore::getValue(InterfaceHandle handle,
                                                               uint32_t* inputIndex)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("Handle is invalid (getValue)"));
    }

    if (handleInfo->handleType != InterfaceType::INPUT) {
        throw(InvalidIdentifier("Handle does not identify an input"));
    }
    auto& fed = *getFederateAt(handleInfo->local_fed_id);
    const std::lock_guard<FederateState> lock(fed);
    return fed.getValue(handle, inputIndex);
}